

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfio.c
# Opt level: O1

int zfpeek(zfp *zf)

{
  gzFile pgVar1;
  byte *pbVar2;
  int __c;
  uint uVar3;
  
  if ((FILE *)zf->fp == (FILE *)0x0) {
    pgVar1 = zf->gz;
    if (pgVar1->have == 0) {
      uVar3 = gzgetc();
    }
    else {
      pgVar1->have = pgVar1->have - 1;
      pgVar1->pos = pgVar1->pos + 1;
      pbVar2 = pgVar1->next;
      pgVar1->next = pbVar2 + 1;
      uVar3 = (uint)*pbVar2;
    }
    if (uVar3 != 0xffffffff) {
      gzungetc(uVar3,zf->gz);
      return uVar3;
    }
  }
  else {
    __c = getc((FILE *)zf->fp);
    if (__c != -1) {
      ungetc(__c,(FILE *)zf->fp);
      return __c;
    }
  }
  return -1;
}

Assistant:

int zfpeek(zfp *zf) {
    int c;

    if (zf->fp) {
	c = getc(zf->fp);
	if (c != EOF)
	    ungetc(c, zf->fp);
    } else {
	c = gzgetc(zf->gz);
	if (c != EOF)
	    gzungetc(c, zf->gz);
    }

    return c;
}